

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

float __thiscall
TPZMatrix<float>::ConditionNumber(TPZMatrix<float> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  float fVar3;
  TPZFMatrix<float> Inv;
  float local_b4;
  TPZFMatrix<float> local_a8;
  
  TPZFMatrix<float>::TPZFMatrix(&local_a8);
  local_b4 = MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(this,&local_a8,ENoDecompose);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<float>::ConditionNumber(int, int64_t, REAL) [TVar = float]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    local_b4 = 0.0;
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    fVar3 = MatrixNorm(&local_a8.super_TPZMatrix<float>,p,numiter,tol);
    local_b4 = local_b4 * fVar3;
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_a8);
  return local_b4;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}